

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O2

void __thiscall sf::Font::Font(Font *this)

{
  _Rb_tree_header *p_Var1;
  
  this->m_streamRec = (void *)0x0;
  this->m_stroker = (void *)0x0;
  this->m_refCount = (int *)0x0;
  this->m_library = (void *)0x0;
  this->m_face = (void *)0x0;
  this->m_isSmooth = true;
  (this->m_info).family.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->m_info).family.field_2 + 8) = 0;
  (this->m_info).family._M_dataplus._M_p = (pointer)&(this->m_info).family.field_2;
  (this->m_info).family._M_string_length = 0;
  (this->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_pages)._M_t._M_impl.super__Rb_tree_header;
  (this->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_pages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pixelBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Font::Font() :
m_library  (NULL),
m_face     (NULL),
m_streamRec(NULL),
m_stroker  (NULL),
m_refCount (NULL),
m_isSmooth (true),
m_info     ()
{
    #ifdef SFML_SYSTEM_ANDROID
        m_stream = NULL;
    #endif
}